

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall QPDF::dumpHPageOffset(QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  Members *pMVar3;
  Pipeline *pPVar4;
  unsigned_long uVar5;
  reference pvVar6;
  reference pvVar7;
  long i;
  size_t i2;
  ulong uVar8;
  QPDFLogger local_58;
  Members *local_48;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *local_40;
  ulong local_38;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  QPDFLogger::getInfo(&local_58,SUB81(*(undefined8 *)&(_Var1._M_head_impl)->log,0));
  pPVar4 = Pipeline::operator<<
                     ((Pipeline *)
                      local_58.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,"min_nobjects: ");
  pPVar4 = Pipeline::operator<<(pPVar4,((_Var1._M_head_impl)->page_offset_hints).min_nobjects);
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"first_page_offset: ");
  i = *(qpdf_offset_t *)((long)&(_Var1._M_head_impl)->page_offset_hints + 8);
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(qpdf_offset_t *)((long)&(_Var2._M_head_impl)->linp + 0x30) <= i) {
    i = i + *(qpdf_offset_t *)((long)&(_Var2._M_head_impl)->linp + 0x38);
  }
  pPVar4 = Pipeline::operator<<(pPVar4,i);
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_delta_nobjects: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x10));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"min_page_length: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x14));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_delta_page_length: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x18));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"min_content_offset: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x1c));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_delta_content_offset: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x20));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"min_content_length: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x24));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_delta_content_length: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x28));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_nshared_objects: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x2c));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_shared_identifier: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x30));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_shared_numerator: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x34));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"shared_denominator: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x38));
  Pipeline::operator<<(pPVar4,"\n");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_40 = (vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *)
             ((long)&(_Var1._M_head_impl)->page_offset_hints + 0x40);
  uVar8 = 0;
  local_48 = _Var1._M_head_impl;
  while( true ) {
    pMVar3 = local_48;
    uVar5 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert
                      ((int *)((long)&((this->m)._M_t.
                                       super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                       .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)
                                      ->linp + 0x18));
    if (uVar5 <= uVar8) break;
    pvVar6 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (local_40,uVar8);
    QPDFLogger::getInfo(&local_58,
                        SUB81(*(undefined8 *)
                               &((this->m)._M_t.
                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                 .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,0
                             ));
    pPVar4 = Pipeline::operator<<
                       ((Pipeline *)
                        local_58.m.
                        super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        "Page ");
    pPVar4 = Pipeline::operator<<(pPVar4,uVar8);
    pPVar4 = Pipeline::operator<<(pPVar4,":\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"  nobjects: ");
    pPVar4 = Pipeline::operator<<
                       (pPVar4,(pMVar3->page_offset_hints).min_nobjects + pvVar6->delta_nobjects);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"  length: ");
    pPVar4 = Pipeline::operator<<
                       (pPVar4,(long)(pMVar3->page_offset_hints).min_page_length +
                               pvVar6->delta_page_length);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"  content_offset: ");
    pPVar4 = Pipeline::operator<<
                       (pPVar4,(long)(pMVar3->page_offset_hints).min_content_offset +
                               pvVar6->delta_content_offset);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"  content_length: ");
    pPVar4 = Pipeline::operator<<
                       (pPVar4,(long)(pMVar3->page_offset_hints).min_content_length +
                               pvVar6->delta_content_length);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"  nshared_objects: ");
    pPVar4 = Pipeline::operator<<(pPVar4,pvVar6->nshared_objects);
    Pipeline::operator<<(pPVar4,"\n");
    local_38 = uVar8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar8 = 0;
    while( true ) {
      uVar5 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert
                        (&pvVar6->nshared_objects);
      if (uVar5 <= uVar8) break;
      QPDFLogger::getInfo(&local_58,
                          SUB81(*(undefined8 *)
                                 &((this->m)._M_t.
                                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                   .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log
                                ,0));
      pPVar4 = Pipeline::operator<<
                         ((Pipeline *)
                          local_58.m.
                          super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,"    identifier ");
      pPVar4 = Pipeline::operator<<(pPVar4,uVar8);
      pPVar4 = Pipeline::operator<<(pPVar4,": ");
      pvVar7 = std::vector<int,_std::allocator<int>_>::at(&pvVar6->shared_identifiers,uVar8);
      pPVar4 = Pipeline::operator<<(pPVar4,*pvVar7);
      Pipeline::operator<<(pPVar4,"\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      QPDFLogger::getInfo(&local_58,
                          SUB81(*(undefined8 *)
                                 &((this->m)._M_t.
                                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                   .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log
                                ,0));
      pPVar4 = Pipeline::operator<<
                         ((Pipeline *)
                          local_58.m.
                          super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,"    numerator ");
      pPVar4 = Pipeline::operator<<(pPVar4,uVar8);
      pPVar4 = Pipeline::operator<<(pPVar4,": ");
      pvVar7 = std::vector<int,_std::allocator<int>_>::at(&pvVar6->shared_numerators,uVar8);
      pPVar4 = Pipeline::operator<<(pPVar4,*pvVar7);
      Pipeline::operator<<(pPVar4,"\n");
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      uVar8 = uVar8 + 1;
    }
    uVar8 = local_38 + 1;
  }
  return;
}

Assistant:

void
QPDF::dumpHPageOffset()
{
    HPageOffset& t = m->page_offset_hints;
    *m->log->getInfo() << "min_nobjects: " << t.min_nobjects << "\n"
                       << "first_page_offset: " << adjusted_offset(t.first_page_offset) << "\n"
                       << "nbits_delta_nobjects: " << t.nbits_delta_nobjects << "\n"
                       << "min_page_length: " << t.min_page_length << "\n"
                       << "nbits_delta_page_length: " << t.nbits_delta_page_length << "\n"
                       << "min_content_offset: " << t.min_content_offset << "\n"
                       << "nbits_delta_content_offset: " << t.nbits_delta_content_offset << "\n"
                       << "min_content_length: " << t.min_content_length << "\n"
                       << "nbits_delta_content_length: " << t.nbits_delta_content_length << "\n"
                       << "nbits_nshared_objects: " << t.nbits_nshared_objects << "\n"
                       << "nbits_shared_identifier: " << t.nbits_shared_identifier << "\n"
                       << "nbits_shared_numerator: " << t.nbits_shared_numerator << "\n"
                       << "shared_denominator: " << t.shared_denominator << "\n";

    for (size_t i1 = 0; i1 < toS(m->linp.npages); ++i1) {
        HPageOffsetEntry& pe = t.entries.at(i1);
        *m->log->getInfo() << "Page " << i1 << ":\n"
                           << "  nobjects: " << pe.delta_nobjects + t.min_nobjects << "\n"
                           << "  length: " << pe.delta_page_length + t.min_page_length
                           << "\n"
                           // content offset is relative to page, not file
                           << "  content_offset: " << pe.delta_content_offset + t.min_content_offset
                           << "\n"
                           << "  content_length: " << pe.delta_content_length + t.min_content_length
                           << "\n"
                           << "  nshared_objects: " << pe.nshared_objects << "\n";
        for (size_t i2 = 0; i2 < toS(pe.nshared_objects); ++i2) {
            *m->log->getInfo() << "    identifier " << i2 << ": " << pe.shared_identifiers.at(i2)
                               << "\n";
            *m->log->getInfo() << "    numerator " << i2 << ": " << pe.shared_numerators.at(i2)
                               << "\n";
        }
    }
}